

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_light.cpp
# Opt level: O1

Light_SampleRes *
embree::QuadLight_sample
          (Light_SampleRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec2f *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  float extraout_XMM0_Dc;
  float fVar5;
  float extraout_XMM0_Dd;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  fVar5 = (s->field_0).field_0.x;
  fVar4 = (s->field_0).field_0.y;
  auVar12._0_4_ =
       (fVar4 * (float)super[0xc].type + fVar5 * (float)super[8].type + (float)super[4].type) -
       (dg->P).field_0.m128[0];
  auVar12._4_4_ =
       (fVar4 * (float)super[0xd].type + fVar5 * (float)super[9].type + (float)super[5].type) -
       (dg->P).field_0.m128[1];
  auVar12._8_4_ =
       (fVar4 * (float)super[0xe].type + fVar5 * (float)super[10].type + (float)super[6].type) -
       (dg->P).field_0.m128[2];
  auVar12._12_4_ =
       (fVar4 * (float)super[0xf].type + fVar5 * (float)super[0xb].type + (float)super[7].type) -
       (dg->P).field_0.m128[3];
  fVar4 = auVar12._8_4_ * auVar12._8_4_;
  fVar5 = auVar12._12_4_ * auVar12._12_4_;
  fVar3 = fVar4 + auVar12._4_4_ * auVar12._4_4_ + auVar12._0_4_ * auVar12._0_4_;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
    fVar5 = extraout_XMM0_Db;
    fVar4 = extraout_XMM0_Dc;
    fVar6 = extraout_XMM0_Dd;
  }
  else {
    fVar3 = SQRT(fVar3);
    fVar6 = fVar5;
  }
  auVar2._4_4_ = fVar3;
  auVar2._0_4_ = fVar3;
  auVar2._8_4_ = fVar3;
  auVar2._12_4_ = fVar3;
  auVar12 = divps(auVar12,auVar2);
  *(undefined1 (*) [16])(__return_storage_ptr__->dir).field_0.m128 = auVar12;
  __return_storage_ptr__->dist = fVar3;
  fVar11 = auVar12._8_4_ * (float)super[0x16].type +
           auVar12._4_4_ * (float)super[0x15].type + auVar12._0_4_ * (float)super[0x14].type;
  fVar3 = (fVar3 * fVar3 * (float)super[0x18].type) / ABS(fVar11);
  __return_storage_ptr__->pdf = fVar3;
  fVar7 = 0.0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  if (0.0 < fVar11) {
    auVar13._4_4_ = fVar5;
    auVar13._0_4_ = fVar3;
    auVar13._8_4_ = fVar4;
    auVar13._12_4_ = fVar6;
    auVar1._4_4_ = fVar5;
    auVar1._0_4_ = fVar3;
    auVar1._8_4_ = fVar4;
    auVar1._12_4_ = fVar6;
    auVar12 = rcpss(auVar13,auVar1);
    fVar10 = (2.0 - fVar3 * auVar12._0_4_) * auVar12._0_4_;
    fVar7 = fVar10 * (float)super[0x10].type;
    fVar8 = fVar10 * (float)super[0x11].type;
    fVar9 = fVar10 * (float)super[0x12].type;
    fVar10 = fVar10 * (float)super[0x13].type;
  }
  (__return_storage_ptr__->weight).field_0.m128[0] = fVar7;
  (__return_storage_ptr__->weight).field_0.m128[1] = fVar8;
  (__return_storage_ptr__->weight).field_0.m128[2] = fVar9;
  (__return_storage_ptr__->weight).field_0.m128[3] = fVar10;
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_SampleRes QuadLight_sample(const Light* super,
                                                              const DifferentialGeometry& dg,
                                                              const Vec2f& s)
{
  const QuadLight* self = (QuadLight*)super;
  Light_SampleRes res;

  // res position on light with density ppdf = 1/area
  // TODO: use solid angle sampling
  const Vec3fa pos = self->position + self->edge1 * s.x + self->edge2 * s.y;

  // extant light vector from the hit point
  const Vec3fa dir = pos - dg.P;
  const float dist = length(dir);

  // normalized light vector
  res.dir = dir / dist;
  res.dist = dist;

  // convert to pdf wrt. solid angle
  const float cosd = dot(self->nnormal, res.dir);
  res.pdf = self->ppdf * (dist * dist) / abs(cosd);

  // emit only to one side
  res.weight = cosd > 0.f ? self->radiance * rcp(res.pdf) : Vec3fa(0.f);

  return res;
}